

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_645bf::ParserImpl::ParseTableConstructor(ParserImpl *this)

{
  String **this_00;
  TokenDetail *t;
  int iVar1;
  TokenDetail op;
  TokenDetail op_00;
  TokenDetail op_01;
  TokenDetail op_02;
  Lexer *pLVar2;
  TokenDetail *pTVar3;
  anon_union_8_2_010d16d7_for_TokenDetail_0 *paVar4;
  ParseException *pPVar5;
  int iVar6;
  ParserImpl *in_RSI;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> _Var7;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_c8;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> index;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> value;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_a8;
  long *local_a0;
  TokenDetail name;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> value_2;
  int iStack_5c;
  
  NextToken(in_RSI);
  if ((in_RSI->current_).token_ != 0x7b) {
    __assert_fail("current_.token_ == \'{\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x2f6,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableConstructor()"
                 );
  }
  t = &in_RSI->current_;
  pLVar2 = (Lexer *)operator_new(0x28);
  iVar6 = (in_RSI->current_).line_;
  pLVar2->state_ = (State *)&PTR__TableDefine_0015b428;
  this_00 = &pLVar2->module_;
  pLVar2->module_ = (String *)0x0;
  *(undefined8 *)&(pLVar2->in_stream_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pLVar2->in_stream_).super__Function_base._M_functor + 8) = 0;
  *(int *)&(pLVar2->in_stream_).super__Function_base._M_manager = iVar6;
  do {
    do {
      pTVar3 = LookAhead(in_RSI);
      if (pTVar3->token_ == 0x7d) {
        pTVar3 = NextToken(in_RSI);
        if (pTVar3->token_ == 0x7d) {
          this->lexer_ = pLVar2;
          return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                  )(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                    )this;
        }
        pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar5,"expect \'}\' for table",t);
        goto LAB_00134faa;
      }
      pTVar3 = LookAhead(in_RSI);
      iVar6 = (int)&local_c8;
      if (pTVar3->token_ == 0x5b) {
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x5b) {
          __assert_fail("current_.token_ == \'[\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x313,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableIndexField()"
                       );
        }
        pTVar3 = LookAhead(in_RSI);
        iVar1 = pTVar3->line_;
        local_c8._M_head_impl = (SyntaxTree *)0x0;
        name.field_0.number_ = 0.0;
        name.module_ = (String *)0x0;
        name.line_ = 0;
        name.column_ = 0;
        name.token_ = 0x11e;
        op.line_ = 0;
        op.column_ = 0;
        op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op.module_ = (String *)0x0;
        op.token_ = 0x11e;
        op._28_4_ = name._28_4_;
        ParseExp((ParserImpl *)&index,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
                 iVar6);
        if (local_c8._M_head_impl != (SyntaxTree *)0x0) {
          (*(local_c8._M_head_impl)->_vptr_SyntaxTree[1])();
        }
        pTVar3 = NextToken(in_RSI);
        if (pTVar3->token_ != 0x5d) {
          pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar5,"expect \']\'",t);
LAB_00135059:
          __cxa_throw(pPVar5,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        pTVar3 = NextToken(in_RSI);
        if (pTVar3->token_ != 0x3d) {
          pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar5,"expect \'=\'",t);
          goto LAB_00135059;
        }
        local_a0 = (long *)0x0;
        value_2._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
        ._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
             (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0;
        op_00._28_4_ = iStack_5c;
        op_00.token_ = 0x11e;
        op_00.line_ = 0;
        op_00.column_ = 0;
        op_00.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op_00.module_ = (String *)0x0;
        ParseExp((ParserImpl *)&value,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                 op_00,(int)&local_a0);
        if (local_a0 != (long *)0x0) {
          (**(code **)(*local_a0 + 8))();
        }
        local_a8._M_t.
        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
             (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             operator_new(0x20);
        ((SyntaxTree *)
        local_a8._M_t.
        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl)->_vptr_SyntaxTree =
             (_func_int **)&PTR__TableIndexField_0015b468;
        ((SyntaxTree *)
        ((long)local_a8._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 8))->_vptr_SyntaxTree
             = (_func_int **)
               index._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        ((SyntaxTree *)
        ((long)local_a8._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x10))->
        _vptr_SyntaxTree =
             (_func_int **)
             value._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        *(int *)&((SyntaxTree *)
                 ((long)local_a8._M_t.
                        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                        .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x18))->
                 _vptr_SyntaxTree = iVar1;
        std::
        vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
        ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                  ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                    *)this_00,&local_a8);
        _Var7._M_head_impl =
             (SyntaxTree *)
             local_a8._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      }
      else {
        pTVar3 = LookAhead(in_RSI);
        if (pTVar3->token_ == 0x115) {
          pTVar3 = LookAhead2(in_RSI);
          if (pTVar3->token_ == 0x3d) {
            paVar4 = &NextToken(in_RSI)->field_0;
            name.field_0 = *paVar4;
            name.module_ = paVar4[1].str_;
            name._16_8_ = paVar4[2];
            name._24_8_ = paVar4[3];
            NextToken(in_RSI);
            if ((in_RSI->current_).token_ != 0x3d) {
              __assert_fail("current_.token_ == \'=\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                            ,0x32a,
                            "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableNameField()"
                           );
            }
            local_c8._M_head_impl = (SyntaxTree *)0x0;
            value_2._M_t.
            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
            super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
                 (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                  )(__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0;
            op_01._28_4_ = iStack_5c;
            op_01.token_ = 0x11e;
            op_01.line_ = 0;
            op_01.column_ = 0;
            op_01.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
            op_01.module_ = (String *)0x0;
            ParseExp((ParserImpl *)&index,
                     (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                     op_01,iVar6);
            if (local_c8._M_head_impl != (SyntaxTree *)0x0) {
              (*(local_c8._M_head_impl)->_vptr_SyntaxTree[1])();
            }
            value._M_t.
            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
            super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
                 (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                  )operator_new(0x30);
            *(undefined ***)
             value._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
                 &PTR__TableNameField_0015b4a8;
            *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
             ((long)value._M_t.
                    super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                    .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 8) =
                 name.field_0;
            *(String **)
             ((long)value._M_t.
                    super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                    .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x10) =
                 name.module_;
            *(undefined8 *)
             ((long)value._M_t.
                    super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                    .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x18) =
                 name._16_8_;
            *(undefined8 *)
             ((long)value._M_t.
                    super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                    .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x20) =
                 name._24_8_;
            ((__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> *
             )((long)value._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x28))->
            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> =
                 (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)
                 index._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
            std::
            vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
            ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                      ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                        *)this_00,&value);
            _Var7._M_head_impl =
                 (SyntaxTree *)
                 value._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
            goto LAB_00134f4f;
          }
        }
        pTVar3 = LookAhead(in_RSI);
        iVar6 = pTVar3->line_;
        index._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
        _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
             (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0;
        name.field_0.number_ = 0.0;
        name.module_ = (String *)0x0;
        name.line_ = 0;
        name.column_ = 0;
        name.token_ = 0x11e;
        op_02.line_ = 0;
        op_02.column_ = 0;
        op_02.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op_02.module_ = (String *)0x0;
        op_02.token_ = 0x11e;
        op_02._28_4_ = name._28_4_;
        ParseExp((ParserImpl *)&value_2,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                 op_02,(int)(ParserImpl *)&index);
        if ((__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)
            index._M_t.
            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
            super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0) {
          (**(code **)(*(long *)index._M_t.
                                super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                                .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 8))
                    ();
        }
        local_c8._M_head_impl = (SyntaxTree *)operator_new(0x18);
        (local_c8._M_head_impl)->_vptr_SyntaxTree = (_func_int **)&PTR__TableArrayField_0015b4e8;
        local_c8._M_head_impl[1]._vptr_SyntaxTree =
             (_func_int **)
             value_2._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        *(int *)&local_c8._M_head_impl[2]._vptr_SyntaxTree = iVar6;
        std::
        vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
        ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                  ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                    *)this_00,
                   (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)&local_c8
                  );
        _Var7._M_head_impl = local_c8._M_head_impl;
      }
LAB_00134f4f:
      if ((tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)_Var7._M_head_impl !=
          (_Head_base<0UL,_luna::SyntaxTree_*,_false>)0x0) {
        (**(code **)((long)(_Var7._M_head_impl)->_vptr_SyntaxTree + 8))();
      }
      pTVar3 = LookAhead(in_RSI);
    } while (pTVar3->token_ == 0x7d);
    NextToken(in_RSI);
    iVar6 = (in_RSI->current_).token_;
  } while ((iVar6 == 0x2c) || (iVar6 == 0x3b));
  pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
  luna::ParseException::ParseException(pPVar5,"expect \',\' or \';\' to split table fields",t);
LAB_00134faa:
  __cxa_throw(pPVar5,&luna::ParseException::typeinfo,luna::Exception::~Exception);
}

Assistant:

std::unique_ptr<SyntaxTree> ParseTableConstructor()
        {
            NextToken();
            assert(current_.token_ == '{');

            std::unique_ptr<TableDefine> table(new TableDefine(current_.line_));

            while (LookAhead().token_ != '}')
            {
                if (LookAhead().token_ == '[')
                    table->fields_.push_back(ParseTableIndexField());
                else if (LookAhead().token_ == Token_Id && LookAhead2().token_ == '=')
                    table->fields_.push_back(ParseTableNameField());
                else
                    table->fields_.push_back(ParseTableArrayField());

                if (LookAhead().token_ != '}')
                {
                    NextToken();
                    if (current_.token_ != ',' && current_.token_ != ';')
                        throw ParseException("expect ',' or ';' to split table fields", current_);
                }
            }

            if (NextToken().token_ != '}')
                throw ParseException("expect '}' for table", current_);
            return std::move(table);
        }